

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O0

void __thiscall gui::ColorPicker::handleMouseMove(ColorPicker *this)

{
  Vector2f *in_stack_00000020;
  ColorPicker *in_stack_00000028;
  
  handleMouseMove(in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

bool ColorPicker::handleMouseMove(const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseMove(mouseParent)) {
        return true;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);

    if (isDragging_) {
        if (sf::Mouse::isButtonPressed(sf::Mouse::Left)) {
            GUI_DEBUG << "ColorPicker::handleMouseMove() with mouse down.\n";
            const auto shadingRectangleSize = getShadingRectangleSize();
            updateShadingRectangle(mouseLocal.x / shadingRectangleSize.x, 1.0f - mouseLocal.y / shadingRectangleSize.y);
        } else {
            isDragging_ = false;
        }
    }

    return isDragging_;
}